

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::MergeFrom
          (EnumDescriptorProto_EnumReservedRange *this,EnumDescriptorProto_EnumReservedRange *from)

{
  uint uVar1;
  void *pvVar2;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this->start_ = from->start_;
    }
    if ((uVar1 & 2) != 0) {
      this->end_ = from->end_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void EnumDescriptorProto_EnumReservedRange::MergeFrom(const EnumDescriptorProto_EnumReservedRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      start_ = from.start_;
    }
    if (cached_has_bits & 0x00000002u) {
      end_ = from.end_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}